

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall ImGuiWindowTempData::ImGuiWindowTempData(ImGuiWindowTempData *this)

{
  this->Indent = 0.0;
  this->ColumnsOffset = 0.0;
  (this->GroupOffset).x = 0.0;
  (this->ChildWindows).Size = 0;
  (this->ChildWindows).Capacity = 0;
  (this->ChildWindows).Data = (ImGuiWindow **)0x0;
  (this->CursorPos).x = 0.0;
  (this->CursorPos).y = 0.0;
  (this->CursorPosPrevLine).x = 0.0;
  (this->CursorPosPrevLine).y = 0.0;
  (this->CursorStartPos).x = 0.0;
  (this->CursorStartPos).y = 0.0;
  (this->CursorMaxPos).x = 0.0;
  (this->CursorMaxPos).y = 0.0;
  (this->IdealMaxPos).x = 0.0;
  (this->IdealMaxPos).y = 0.0;
  (this->CurrLineSize).x = 0.0;
  (this->CurrLineSize).y = 0.0;
  (this->PrevLineSize).x = 0.0;
  (this->PrevLineSize).y = 0.0;
  (this->LastItemRect).Min.x = 0.0;
  (this->LastItemRect).Min.y = 0.0;
  (this->LastItemRect).Max.x = 0.0;
  (this->LastItemRect).Max.y = 0.0;
  (this->LastItemDisplayRect).Min.x = 0.0;
  (this->LastItemDisplayRect).Min.y = 0.0;
  (this->LastItemDisplayRect).Max.x = 0.0;
  (this->LastItemDisplayRect).Max.y = 0.0;
  (this->MenuBarOffset).x = 0.0;
  (this->MenuBarOffset).y = 0.0;
  (this->MenuColumns).Spacing = 0.0;
  (this->MenuColumns).Width = 0.0;
  (this->MenuColumns).NextWidth = 0.0;
  (this->MenuColumns).Pos[0] = 0.0;
  (this->MenuColumns).Pos[1] = 0.0;
  (this->MenuColumns).Pos[2] = 0.0;
  *(undefined8 *)((this->MenuColumns).Pos + 2) = 0;
  (this->MenuColumns).NextWidths[1] = 0.0;
  (this->MenuColumns).NextWidths[2] = 0.0;
  (this->ItemWidthStack).Size = 0;
  (this->ItemWidthStack).Capacity = 0;
  (this->ItemWidthStack).Data = (float *)0x0;
  (this->TextWrapPosStack).Size = 0;
  (this->TextWrapPosStack).Capacity = 0;
  (this->TextWrapPosStack).Data = (float *)0x0;
  *(undefined8 *)((long)&(this->TextWrapPosStack).Data + 6) = 0;
  (this->StackSizesOnBegin).SizeOfFontStack = 0;
  (this->StackSizesOnBegin).SizeOfFocusScopeStack = 0;
  (this->StackSizesOnBegin).SizeOfGroupStack = 0;
  (this->StackSizesOnBegin).SizeOfBeginPopupStack = 0;
  return;
}

Assistant:

ImVec1()         { x = 0.0f; }